

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O3

wchar_t header_pax_extensions
                  (archive_read *a,tar *tar,archive_entry *entry,void *h,size_t *unconsumed)

{
  archive_string *as;
  wchar_t wVar1;
  int iVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  char *pcVar5;
  char *pcVar6;
  byte *name;
  archive_acl *paVar7;
  long lVar8;
  byte *pbVar9;
  dev_t dVar10;
  size_t sVar11;
  int64_t iVar12;
  archive_string_conv *paVar13;
  archive_string *paVar14;
  byte bVar15;
  char *p;
  int iVar16;
  uint uVar17;
  uint uVar18;
  archive_entry *paVar19;
  archive_entry *paVar20;
  archive_entry *entry_00;
  size_t sVar21;
  uint uVar22;
  char cVar23;
  char *pcVar24;
  byte *pbVar25;
  ulong uVar26;
  char *pcVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int64_t s;
  long local_80;
  time_t local_78;
  int64_t *local_70;
  archive_string *local_68;
  wchar_t local_5c;
  size_t local_58;
  archive_entry *local_50;
  int64_t local_48;
  char *local_40;
  char *local_38;
  
  wVar1 = read_body_to_string(a,(tar *)&tar->pax_header,(archive_string *)h,unconsumed,unconsumed);
  if (wVar1 != L'\0') {
    return wVar1;
  }
  wVar1 = tar_read_header(a,tar,entry,unconsumed);
  if ((wVar1 != L'\0') && (wVar1 != L'\xffffffec')) {
    return wVar1;
  }
  pcVar27 = (tar->pax_header).s;
  pcVar5 = (char *)strlen(pcVar27);
  tar->pax_hdrcharset_binary = 0;
  paVar14 = &tar->entry_gname;
  wVar4 = L'\0';
  (tar->entry_gname).length = 0;
  as = &tar->entry_linkpath;
  (tar->entry_linkpath).length = 0;
  (tar->entry_pathname).length = 0;
  (tar->entry_pathname_override).length = 0;
  local_68 = &tar->entry_uname;
  (tar->entry_uname).length = 0;
  if (pcVar5 == (char *)0x0) goto LAB_00430796;
  local_70 = &tar->sparse_offset;
  local_40 = "Can\'t allocate memory for SCHILY.acl.default";
  wVar4 = L'\0';
LAB_0042f85e:
  local_5c = wVar4;
  paVar19 = (archive_entry *)(pcVar27 + (long)pcVar5);
  pcVar6 = pcVar27 + (long)pcVar5 + -1;
  uVar26 = 0;
  p = pcVar5;
  pcVar24 = pcVar27;
  do {
    cVar23 = *pcVar24;
    if (cVar23 == ' ') {
      paVar19 = (archive_entry *)(pcVar24 + 1);
      pcVar6 = pcVar24;
      break;
    }
    if ((byte)(cVar23 - 0x3aU) < 0xf6) {
      pcVar27 = "Ignoring malformed pax extended attributes";
      goto LAB_0043072a;
    }
    uVar26 = (ulong)(byte)(cVar23 - 0x30) + uVar26 * 10;
    if (999999 < uVar26) {
      pcVar27 = "Rejecting pax extended attribute > 1MB";
      goto LAB_0043072a;
    }
    pcVar24 = pcVar24 + 1;
    p = p + -1;
  } while (p != (char *)0x0);
  pcVar24 = (char *)(uVar26 - 1);
  if ((pcVar5 <= pcVar24) || (pcVar27[(long)pcVar24] != '\n')) {
    pcVar27 = "Ignoring malformed pax extended attribute";
LAB_0043072a:
    archive_set_error(&a->archive,-1,pcVar27);
    wVar3 = L'\xffffffec';
    goto LAB_004309aa;
  }
  pcVar27[(long)pcVar24] = '\0';
  cVar23 = *(char *)&paVar19->archive;
  paVar20 = paVar19;
  if (cVar23 == '=') {
    wVar3 = L'\xffffffff';
    goto LAB_004309aa;
  }
  while( true ) {
    entry_00 = (archive_entry *)((long)&paVar20->archive + 1);
    local_38 = pcVar27;
    if (cVar23 == '\0') {
      archive_set_error(&a->archive,-1,"Invalid pax extended attributes");
      wVar3 = L'\xffffffec';
      goto LAB_004309aa;
    }
    if (cVar23 == '=') break;
    cVar23 = *(char *)&entry_00->archive;
    paVar20 = entry_00;
  }
  *(char *)&paVar20->archive = '\0';
  bVar15 = *(byte *)&paVar19->archive;
  if (0x60 < bVar15) {
    switch(bVar15) {
    case 0x61:
      iVar2 = strcmp((char *)paVar19,"atime");
      if (iVar2 == 0) {
        pax_time((char *)entry_00,&local_78,&local_80);
        archive_entry_set_atime(entry,local_78,local_80);
      }
      break;
    default:
switchD_0042f963_caseD_62:
      wVar4 = L'\0';
      goto LAB_0043064a;
    case 99:
      iVar2 = strcmp((char *)paVar19,"ctime");
      if (iVar2 == 0) {
        pax_time((char *)entry_00,&local_78,&local_80);
        archive_entry_set_ctime(entry,local_78,local_80);
      }
      break;
    case 0x67:
      iVar2 = strcmp((char *)paVar19,"gid");
      if (iVar2 == 0) {
        sVar11 = strlen((char *)entry_00);
        iVar12 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
        archive_entry_set_gid(entry,iVar12);
      }
      else {
        iVar2 = strcmp((char *)paVar19,"gname");
        if (iVar2 == 0) {
          (tar->entry_gname).length = 0;
          sVar11 = strlen((char *)entry_00);
          archive_strncat(paVar14,entry_00,sVar11);
          wVar4 = L'\0';
          goto LAB_0043064a;
        }
      }
      break;
    case 0x68:
      iVar2 = strcmp((char *)paVar19,"hdrcharset");
      if (iVar2 == 0) {
        iVar2 = strcmp((char *)entry_00,"BINARY");
        if (iVar2 == 0) {
          tar->pax_hdrcharset_binary = 1;
        }
        else {
          iVar2 = strcmp((char *)entry_00,"ISO-IR 10646 2000 UTF-8");
          if (iVar2 == 0) {
            tar->pax_hdrcharset_binary = 0;
          }
        }
      }
      break;
    case 0x6c:
      iVar2 = strcmp((char *)paVar19,"linkpath");
      if (iVar2 == 0) {
        (tar->entry_linkpath).length = 0;
        sVar11 = strlen((char *)entry_00);
        archive_strncat(as,entry_00,sVar11);
      }
      goto LAB_0042fd9e;
    case 0x6d:
      iVar2 = strcmp((char *)paVar19,"mtime");
      if (iVar2 == 0) {
        pax_time((char *)entry_00,&local_78,&local_80);
        archive_entry_set_mtime(entry,local_78,local_80);
      }
      break;
    case 0x70:
      iVar2 = strcmp((char *)paVar19,"path");
      if (iVar2 == 0) {
        (tar->entry_pathname).length = 0;
        sVar11 = strlen((char *)entry_00);
        archive_strncat(&tar->entry_pathname,entry_00,sVar11);
      }
LAB_0042fd9e:
      wVar4 = L'\0';
      goto LAB_0043064a;
    case 0x73:
      iVar2 = strcmp((char *)paVar19,"size");
      if (iVar2 == 0) {
        sVar11 = strlen((char *)entry_00);
        iVar12 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
        tar->entry_bytes_remaining = iVar12;
        if (tar->realsize < 0) {
          archive_entry_set_size(entry,iVar12);
          tar->realsize = tar->entry_bytes_remaining;
        }
      }
      break;
    case 0x75:
      iVar2 = strcmp((char *)paVar19,"uid");
      if (iVar2 == 0) {
        sVar11 = strlen((char *)entry_00);
        iVar12 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
        archive_entry_set_uid(entry,iVar12);
      }
      else {
        iVar2 = strcmp((char *)paVar19,"uname");
        if (iVar2 == 0) {
          (tar->entry_uname).length = 0;
          sVar11 = strlen((char *)entry_00);
          archive_strncat(local_68,entry_00,sVar11);
        }
      }
    }
    goto LAB_0043062e;
  }
  if (bVar15 == 0x47) {
    iVar2 = strcmp((char *)paVar19,"GNU.sparse.numblocks");
    if (iVar2 == 0) {
      *(undefined4 *)local_70 = 0xffffffff;
      *(undefined4 *)((long)local_70 + 4) = 0xffffffff;
      *(undefined4 *)(local_70 + 1) = 0xffffffff;
      *(undefined4 *)((long)local_70 + 0xc) = 0xffffffff;
      tar->sparse_gnu_major = 0;
      tar->sparse_gnu_minor = 0;
    }
    iVar2 = strcmp((char *)paVar19,"GNU.sparse.offset");
    if (iVar2 == 0) {
      sVar11 = strlen((char *)entry_00);
      iVar12 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
      tar->sparse_offset = iVar12;
      if (tar->sparse_numbytes != -1) {
        wVar4 = gnu_add_sparse_entry(a,tar,iVar12,tar->sparse_numbytes);
        if (wVar4 != L'\0') goto LAB_004309a4;
        *(undefined4 *)local_70 = 0xffffffff;
        *(undefined4 *)((long)local_70 + 4) = 0xffffffff;
        *(undefined4 *)(local_70 + 1) = 0xffffffff;
        *(undefined4 *)((long)local_70 + 0xc) = 0xffffffff;
      }
    }
    iVar2 = strcmp((char *)paVar19,"GNU.sparse.numbytes");
    if (iVar2 == 0) {
      sVar11 = strlen((char *)entry_00);
      iVar12 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
      tar->sparse_numbytes = iVar12;
      if (iVar12 != -1) {
        wVar4 = gnu_add_sparse_entry(a,tar,tar->sparse_offset,iVar12);
        if (wVar4 != L'\0') goto LAB_004309a4;
        *(undefined4 *)local_70 = 0xffffffff;
        *(undefined4 *)((long)local_70 + 4) = 0xffffffff;
        *(undefined4 *)(local_70 + 1) = 0xffffffff;
        *(undefined4 *)((long)local_70 + 0xc) = 0xffffffff;
      }
    }
    iVar2 = strcmp((char *)paVar19,"GNU.sparse.size");
    if (iVar2 == 0) {
      sVar11 = strlen((char *)entry_00);
      iVar12 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
      tar->realsize = iVar12;
      archive_entry_set_size(entry,iVar12);
    }
    iVar2 = strcmp((char *)paVar19,"GNU.sparse.map");
    if (iVar2 == 0) {
      tar->sparse_gnu_major = 0;
      tar->sparse_gnu_minor = 1;
      local_48 = -1;
      paVar20 = entry_00;
      do {
        for (sVar21 = 0;
            (cVar23 = *(char *)((long)&paVar20->archive + sVar21), cVar23 != '\0' && (cVar23 != ',')
            ); sVar21 = sVar21 + 1) {
          if ((byte)(cVar23 - 0x3aU) < 0xf6) {
            wVar4 = L'\xffffffec';
            goto LAB_0043064a;
          }
        }
        local_58 = sVar21;
        local_50 = paVar20;
        iVar12 = tar_atol_base_n((char *)paVar20,sVar21,L'\n');
        if (local_48 < 0) {
          if (iVar12 < 0) {
            wVar4 = L'\xffffffec';
            goto LAB_0043064a;
          }
        }
        else {
          wVar4 = L'\xffffffec';
          if ((iVar12 < 0) || (wVar3 = gnu_add_sparse_entry(a,tar,local_48,iVar12), wVar3 != L'\0'))
          goto LAB_0043064a;
          cVar23 = *(char *)((long)&local_50->archive + local_58);
          iVar12 = -1;
        }
        paVar20 = (archive_entry *)((long)&local_50->archive + local_58 + 1);
        local_48 = iVar12;
      } while (cVar23 != '\0');
    }
    iVar2 = strcmp((char *)paVar19,"GNU.sparse.major");
    if (iVar2 == 0) {
      sVar11 = strlen((char *)entry_00);
      iVar12 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
      tar->sparse_gnu_major = (int)iVar12;
      tar->sparse_gnu_pending = '\x01';
    }
    iVar2 = strcmp((char *)paVar19,"GNU.sparse.minor");
    if (iVar2 == 0) {
      sVar11 = strlen((char *)entry_00);
      iVar12 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
      tar->sparse_gnu_minor = (int)iVar12;
      tar->sparse_gnu_pending = '\x01';
    }
    iVar2 = strcmp((char *)paVar19,"GNU.sparse.name");
    if (iVar2 == 0) {
      (tar->entry_pathname_override).length = 0;
      sVar11 = strlen((char *)entry_00);
      archive_strncat(&tar->entry_pathname_override,entry_00,sVar11);
    }
    iVar2 = strcmp((char *)paVar19,"GNU.sparse.realsize");
    if (iVar2 == 0) {
      sVar11 = strlen((char *)entry_00);
      iVar12 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
      tar->realsize = iVar12;
      archive_entry_set_size(entry,iVar12);
    }
    goto LAB_0043062e;
  }
  if (bVar15 == 0x4c) {
    iVar2 = strcmp((char *)paVar19,"LIBARCHIVE.creationtime");
    if (iVar2 == 0) {
      pax_time((char *)entry_00,&local_78,&local_80);
      archive_entry_set_birthtime(entry,local_78,local_80);
    }
    auVar28[0] = -(*(char *)&paVar19->archive == 'L');
    auVar28[1] = -(*(char *)((long)&paVar19->archive + 1) == 'I');
    auVar28[2] = -(*(char *)((long)&paVar19->archive + 2) == 'B');
    auVar28[3] = -(*(char *)((long)&paVar19->archive + 3) == 'A');
    auVar28[4] = -(*(char *)((long)&paVar19->archive + 4) == 'R');
    auVar28[5] = -(*(char *)((long)&paVar19->archive + 5) == 'C');
    auVar28[6] = -(*(char *)((long)&paVar19->archive + 6) == 'H');
    auVar28[7] = -(*(char *)((long)&paVar19->archive + 7) == 'I');
    auVar28[8] = -(*(char *)&paVar19->stat == 'V');
    auVar28[9] = -(*(char *)((long)&paVar19->stat + 1) == 'E');
    auVar28[10] = -(*(char *)((long)&paVar19->stat + 2) == '.');
    auVar28[0xb] = -(*(char *)((long)&paVar19->stat + 3) == 'x');
    auVar28[0xc] = -(*(char *)((long)&paVar19->stat + 4) == 'a');
    auVar28[0xd] = -(*(char *)((long)&paVar19->stat + 5) == 't');
    auVar28[0xe] = -(*(char *)((long)&paVar19->stat + 6) == 't');
    auVar28[0xf] = -(*(char *)((long)&paVar19->stat + 7) == 'r');
    auVar29[0] = -((char)paVar19->stat_valid == '.');
    auVar29[1] = 0xff;
    auVar29[2] = 0xff;
    auVar29[3] = 0xff;
    auVar29[4] = 0xff;
    auVar29[5] = 0xff;
    auVar29[6] = 0xff;
    auVar29[7] = 0xff;
    auVar29[8] = 0xff;
    auVar29[9] = 0xff;
    auVar29[10] = 0xff;
    auVar29[0xb] = 0xff;
    auVar29[0xc] = 0xff;
    auVar29[0xd] = 0xff;
    auVar29[0xe] = 0xff;
    auVar29[0xf] = 0xff;
    auVar29 = auVar29 & auVar28;
    if (((ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) | (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar29[0xf] >> 7) << 0xf) == 0xffff) &&
       (sVar11 = strlen((char *)paVar19), 0x11 < sVar11)) {
      pbVar25 = (byte *)(pcVar6 + 0x12);
      sVar11 = strlen((char *)pbVar25);
      name = (byte *)malloc(sVar11 + 1);
      pbVar9 = name;
      if (name != (byte *)0x0) {
        do {
          bVar15 = *pbVar25;
          if (bVar15 == 0x25) {
            iVar2 = (int)(char)pbVar25[1];
            if ((pbVar25[1] == 0) || (iVar16 = (int)(char)pbVar25[2], pbVar25[2] == 0))
            goto LAB_00430129;
            uVar18 = iVar2 - 0x30;
            if (9 < uVar18) {
              if (iVar2 - 0x41U < 6) {
                uVar18 = iVar2 - 0x37;
              }
              else {
                uVar18 = iVar2 - 0x57;
                if (5 < iVar2 - 0x61U) {
                  uVar18 = 0xffffffff;
                }
              }
            }
            uVar17 = iVar16 - 0x30;
            if (9 < uVar17) {
              if (iVar16 - 0x41U < 6) {
                uVar17 = iVar16 - 0x37;
              }
              else {
                uVar17 = iVar16 - 0x57;
                if (5 < iVar16 - 0x61U) {
                  uVar17 = 0xffffffff;
                }
              }
            }
            if (((int)uVar18 < 0) || ((int)uVar17 < 0)) goto LAB_00430129;
            pbVar25 = pbVar25 + 3;
            bVar15 = (byte)uVar17 | (byte)(uVar18 << 4);
          }
          else {
            if (bVar15 == 0) goto LAB_00430423;
LAB_00430129:
            pbVar25 = pbVar25 + 1;
          }
          *pbVar9 = bVar15;
          pbVar9 = pbVar9 + 1;
        } while( true );
      }
    }
    goto LAB_0043062e;
  }
  if (bVar15 != 0x53) goto switchD_0042f963_caseD_62;
  iVar2 = strcmp((char *)paVar19,"SCHILY.acl.access");
  if (iVar2 == 0) {
    if (tar->sconv_acl == (archive_string_conv *)0x0) {
      paVar13 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
      tar->sconv_acl = paVar13;
      if (paVar13 == (archive_string_conv *)0x0) goto LAB_004309a4;
    }
    paVar7 = archive_entry_acl(entry);
    wVar4 = archive_acl_parse_l(paVar7,(char *)entry_00,L'Ā',tar->sconv_acl);
    if (wVar4 != L'\0') {
      if (wVar4 == L'\xffffffe2') {
        local_40 = "Can\'t allocate memory for SCHILY.acl.access";
        goto LAB_0043098c;
      }
      pcVar27 = "Parse error: SCHILY.acl.access";
LAB_004303de:
      archive_set_error(&a->archive,-1,pcVar27);
    }
    goto LAB_0043064a;
  }
  iVar2 = strcmp((char *)paVar19,"SCHILY.acl.default");
  if (iVar2 == 0) {
    if (tar->sconv_acl == (archive_string_conv *)0x0) {
      paVar13 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
      tar->sconv_acl = paVar13;
      if (paVar13 == (archive_string_conv *)0x0) goto LAB_004309a4;
    }
    paVar7 = archive_entry_acl(entry);
    wVar4 = archive_acl_parse_l(paVar7,(char *)entry_00,L'Ȁ',tar->sconv_acl);
    if (wVar4 == L'\0') goto LAB_0043064a;
    if (wVar4 != L'\xffffffe2') {
      pcVar27 = "Parse error: SCHILY.acl.default";
      goto LAB_004303de;
    }
LAB_0043098c:
    archive_set_error(&a->archive,0xc,local_40);
    goto LAB_004309a4;
  }
  iVar2 = strcmp((char *)paVar19,"SCHILY.devmajor");
  if (iVar2 == 0) {
    sVar11 = strlen((char *)entry_00);
    dVar10 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
    archive_entry_set_rdevmajor(entry,dVar10);
  }
  else {
    iVar2 = strcmp((char *)paVar19,"SCHILY.devminor");
    if (iVar2 == 0) {
      sVar11 = strlen((char *)entry_00);
      dVar10 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
      archive_entry_set_rdevminor(entry,dVar10);
    }
    else {
      iVar2 = strcmp((char *)paVar19,"SCHILY.fflags");
      if (iVar2 == 0) {
        archive_entry_copy_fflags_text(entry,(char *)entry_00);
      }
      else {
        iVar2 = strcmp((char *)paVar19,"SCHILY.dev");
        if (iVar2 == 0) {
          sVar11 = strlen((char *)entry_00);
          dVar10 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
          archive_entry_set_dev(entry,dVar10);
        }
        else {
          iVar2 = strcmp((char *)paVar19,"SCHILY.ino");
          if (iVar2 != 0) {
            iVar2 = strcmp((char *)paVar19,"SCHILY.nlink");
            if (iVar2 == 0) {
              sVar11 = strlen((char *)entry_00);
              iVar12 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
              archive_entry_set_nlink(entry,(uint)iVar12);
              goto LAB_0043062e;
            }
            iVar2 = strcmp((char *)paVar19,"SCHILY.realsize");
            if (iVar2 == 0) {
              sVar11 = strlen((char *)entry_00);
              iVar12 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
              tar->realsize = iVar12;
              archive_entry_set_size(entry,iVar12);
            }
            else {
              iVar2 = strcmp((char *)paVar19,"SUN.holesdata");
              if (iVar2 == 0) {
                wVar3 = solaris_sparse_parse(a,tar,entry_00,p);
                wVar4 = L'\0';
                if (wVar3 < L'\0') {
                  if (wVar3 != L'\xffffffe2') {
                    archive_set_error(&a->archive,-1,"Parse error: SUN.holesdata");
                    wVar4 = wVar3;
                    goto LAB_0043064a;
                  }
                  goto LAB_004309a4;
                }
                goto LAB_0043064a;
              }
            }
            wVar4 = L'\0';
            goto LAB_0043064a;
          }
          sVar11 = strlen((char *)entry_00);
          iVar12 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
          archive_entry_set_ino(entry,iVar12);
        }
      }
    }
  }
  goto LAB_0043062e;
LAB_00430423:
  *pbVar9 = 0;
  sVar11 = strlen((char *)entry_00);
  if (base64_decode_decode_table[0x42] != '\x01') {
    base64_decode_decode_table._112_4_ = 0xffffffff;
    base64_decode_decode_table._116_4_ = 0xffffffff;
    base64_decode_decode_table._120_4_ = 0xffffffff;
    base64_decode_decode_table._124_4_ = 0xffffffff;
    base64_decode_decode_table._96_4_ = 0xffffffff;
    base64_decode_decode_table._100_4_ = 0xffffffff;
    base64_decode_decode_table._104_4_ = 0xffffffff;
    base64_decode_decode_table._108_4_ = 0xffffffff;
    base64_decode_decode_table._80_4_ = 0xffffffff;
    base64_decode_decode_table._84_4_ = 0xffffffff;
    base64_decode_decode_table._88_4_ = 0xffffffff;
    base64_decode_decode_table._92_4_ = 0xffffffff;
    base64_decode_decode_table._64_4_ = 0xffffffff;
    base64_decode_decode_table._68_4_ = 0xffffffff;
    base64_decode_decode_table._72_4_ = 0xffffffff;
    base64_decode_decode_table._76_4_ = 0xffffffff;
    base64_decode_decode_table._48_4_ = 0xffffffff;
    base64_decode_decode_table._52_4_ = 0xffffffff;
    base64_decode_decode_table._56_4_ = 0xffffffff;
    base64_decode_decode_table._60_4_ = 0xffffffff;
    base64_decode_decode_table._32_4_ = 0xffffffff;
    base64_decode_decode_table._36_4_ = 0xffffffff;
    base64_decode_decode_table._40_4_ = 0xffffffff;
    base64_decode_decode_table._44_4_ = 0xffffffff;
    base64_decode_decode_table._16_4_ = 0xffffffff;
    base64_decode_decode_table._20_4_ = 0xffffffff;
    base64_decode_decode_table._24_4_ = 0xffffffff;
    base64_decode_decode_table._28_4_ = 0xffffffff;
    base64_decode_decode_table._0_4_ = 0xffffffff;
    base64_decode_decode_table._4_4_ = 0xffffffff;
    base64_decode_decode_table._8_4_ = 0xffffffff;
    base64_decode_decode_table._12_4_ = 0xffffffff;
    lVar8 = 0;
    do {
      base64_decode_decode_table[(byte)(&base64_decode_digits)[lVar8]] = (char)lVar8;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x40);
  }
  pbVar9 = (byte *)malloc((sVar11 - (sVar11 >> 2)) + 1);
  if (pbVar9 != (byte *)0x0) {
    pbVar25 = pbVar9;
    if (sVar11 == 0) {
      sVar21 = 0;
    }
    else {
      do {
        uVar17 = 0;
        uVar18 = 0;
        do {
          lVar8 = 1 - sVar11;
          paVar19 = entry_00;
LAB_004304e5:
          bVar15 = *(byte *)&paVar19->archive;
          if ((bVar15 == 0x3d) || (bVar15 == 0x5f)) goto LAB_00430549;
          if (((char)bVar15 < ' ') || ((byte)base64_decode_decode_table[bVar15] == 0xff))
          goto LAB_00430509;
          uVar17 = uVar17 << 6 | (uint)(byte)base64_decode_decode_table[bVar15];
          uVar22 = uVar18 + 1;
          if (2 < uVar18) break;
          entry_00 = (archive_entry *)((long)&paVar19->archive + 1);
          sVar11 = -lVar8;
          uVar18 = uVar22;
        } while (lVar8 != 0);
        paVar19 = (archive_entry *)((long)&paVar19->archive + 1);
        sVar11 = -lVar8;
LAB_0043054c:
        iVar2 = uVar17 << (('\x04' - (char)uVar22) * '\x06' & 0x1fU);
        if (uVar22 == 2) {
LAB_00430573:
          *pbVar25 = (byte)((uint)iVar2 >> 0x10);
        }
        else {
          if (uVar22 == 3) {
LAB_00430570:
            pbVar25[1] = (byte)((uint)iVar2 >> 8);
            goto LAB_00430573;
          }
          if (uVar22 == 4) {
            pbVar25[2] = (byte)iVar2;
            goto LAB_00430570;
          }
        }
        iVar2 = uVar22 * 3 + 3;
        if (-1 < (int)(uVar22 * 3)) {
          iVar2 = uVar22 * 3;
        }
        pbVar25 = pbVar25 + (iVar2 >> 2);
        entry_00 = paVar19;
      } while (sVar11 != 0);
      sVar21 = (long)pbVar25 - (long)pbVar9;
    }
    archive_entry_xattr_add_entry(entry,(char *)name,pbVar9,sVar21);
    free(name);
    name = pbVar9;
  }
  free(name);
LAB_0043062e:
  wVar4 = L'\0';
LAB_0043064a:
  if (local_5c < wVar4) {
    wVar4 = local_5c;
  }
  pcVar27 = local_38 + uVar26;
  pcVar5 = pcVar5 + -uVar26;
  if (pcVar5 == (char *)0x0) goto LAB_0043077a;
  goto LAB_0042f85e;
LAB_00430509:
  paVar19 = (archive_entry *)((long)&paVar19->archive + 1);
  lVar8 = lVar8 + 1;
  if (lVar8 == 1) {
    paVar19 = (archive_entry *)((long)&entry_00->archive + sVar11);
LAB_00430549:
    sVar11 = 0;
    uVar22 = uVar18;
    goto LAB_0043054c;
  }
  goto LAB_004304e5;
LAB_0043077a:
  if (tar->pax_hdrcharset_binary == 0) {
LAB_00430796:
    paVar13 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
    if (paVar13 == (archive_string_conv *)0x0) {
LAB_004309a4:
      wVar3 = L'\xffffffe2';
      goto LAB_004309aa;
    }
    if (tar->compat_2x != 0) {
      archive_string_conversion_set_opt(paVar13,L'\x01');
    }
  }
  else {
    paVar13 = tar->opt_sconv;
  }
  sVar21 = (tar->entry_gname).length;
  if ((sVar21 != 0) &&
     (wVar3 = _archive_entry_copy_gname_l(entry,paVar14->s,sVar21,paVar13), wVar3 != L'\0')) {
    wVar4 = set_conversion_failed_error(a,paVar13,"Gname");
    wVar3 = L'\xffffffe2';
    if (wVar4 == L'\xffffffe2') goto LAB_004309aa;
    archive_entry_copy_gname(entry,paVar14->s);
  }
  sVar21 = (tar->entry_linkpath).length;
  if ((sVar21 != 0) &&
     (wVar3 = _archive_entry_copy_link_l(entry,as->s,sVar21,paVar13), wVar3 != L'\0')) {
    wVar4 = set_conversion_failed_error(a,paVar13,"Linkname");
    wVar3 = L'\xffffffe2';
    if (wVar4 == L'\xffffffe2') goto LAB_004309aa;
    archive_entry_copy_link(entry,as->s);
  }
  paVar14 = &tar->entry_pathname_override;
  if ((((tar->entry_pathname_override).length != 0) ||
      (paVar14 = &tar->entry_pathname, (tar->entry_pathname).length != 0)) &&
     (wVar3 = _archive_entry_copy_pathname_l(entry,paVar14->s,paVar14->length,paVar13),
     wVar3 != L'\0')) {
    wVar4 = set_conversion_failed_error(a,paVar13,"Pathname");
    wVar3 = L'\xffffffe2';
    if (wVar4 == L'\xffffffe2') goto LAB_004309aa;
    archive_entry_copy_pathname(entry,paVar14->s);
  }
  sVar21 = (tar->entry_uname).length;
  wVar3 = wVar4;
  if ((sVar21 != 0) &&
     (wVar4 = _archive_entry_copy_uname_l(entry,local_68->s,sVar21,paVar13), wVar4 != L'\0')) {
    wVar4 = set_conversion_failed_error(a,paVar13,"Uname");
    wVar3 = L'\xffffffe2';
    if (wVar4 != L'\xffffffe2') {
      archive_entry_copy_uname(entry,local_68->s);
      wVar3 = wVar4;
    }
  }
LAB_004309aa:
  if (wVar1 < wVar3) {
    wVar3 = wVar1;
  }
  tar->entry_padding = (ulong)(-(int)tar->entry_bytes_remaining & 0x1ff);
  return wVar3;
}

Assistant:

static int
header_pax_extensions(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h, size_t *unconsumed)
{
	int err, err2;

	err = read_body_to_string(a, tar, &(tar->pax_header), h, unconsumed);
	if (err != ARCHIVE_OK)
		return (err);

	/* Parse the next header. */
	err = tar_read_header(a, tar, entry, unconsumed);
	if ((err != ARCHIVE_OK) && (err != ARCHIVE_WARN))
		return (err);

	/*
	 * TODO: Parse global/default options into 'entry' struct here
	 * before handling file-specific options.
	 *
	 * This design (parse standard header, then overwrite with pax
	 * extended attribute data) usually works well, but isn't ideal;
	 * it would be better to parse the pax extended attributes first
	 * and then skip any fields in the standard header that were
	 * defined in the pax header.
	 */
	err2 = pax_header(a, tar, entry, tar->pax_header.s);
	err =  err_combine(err, err2);
	tar->entry_padding = 0x1ff & (-tar->entry_bytes_remaining);
	return (err);
}